

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O0

Bigint * pow5mult(Bigint *b,int k)

{
  Bigint *pBVar1;
  int i;
  Bigint *p51;
  Bigint *p5;
  Bigint *b1;
  Bigint *pBStack_18;
  int k_local;
  Bigint *b_local;
  
  pBStack_18 = b;
  if (((k & 3U) == 0) ||
     (pBStack_18 = multadd(b,pow5mult::p05[(int)((k & 3U) - 1)],0), pBStack_18 != (Bigint *)0x0)) {
    b1._4_4_ = k >> 2;
    if (b1._4_4_ == 0) {
      b_local = pBStack_18;
    }
    else {
      p51 = i2b(0x271);
      if (p51 == (Bigint *)0x0) {
        Bfree(pBStack_18);
        b_local = (Bigint *)0x0;
      }
      else {
        do {
          if ((b1._4_4_ & 1) != 0) {
            pBVar1 = mult(pBStack_18,p51);
            Bfree(pBStack_18);
            pBStack_18 = pBVar1;
            if (pBVar1 == (Bigint *)0x0) {
              Bfree(p51);
              return (Bigint *)0x0;
            }
          }
          b1._4_4_ = (int)b1._4_4_ >> 1;
          if (b1._4_4_ == 0) {
            Bfree(p51);
            return pBStack_18;
          }
          pBVar1 = mult(p51,p51);
          Bfree(p51);
          p51 = pBVar1;
        } while (pBVar1 != (Bigint *)0x0);
        Bfree(pBStack_18);
        b_local = (Bigint *)0x0;
      }
    }
  }
  else {
    b_local = (Bigint *)0x0;
  }
  return b_local;
}

Assistant:

static Bigint *
pow5mult(Bigint *b, int k)
{
    Bigint *b1, *p5, *p51;
    int i;
    static int p05[3] = { 5, 25, 125 };

    if ((i = k & 3)) {
        b = multadd(b, p05[i-1], 0);
        if (b == NULL)
            return NULL;
    }

    if (!(k >>= 2))
        return b;
    p5 = i2b(625);
    if (p5 == NULL) {
        Bfree(b);
        return NULL;
    }

    for(;;) {
        if (k & 1) {
            b1 = mult(b, p5);
            Bfree(b);
            b = b1;
            if (b == NULL) {
                Bfree(p5);
                return NULL;
            }
        }
        if (!(k >>= 1))
            break;
        p51 = mult(p5, p5);
        Bfree(p5);
        p5 = p51;
        if (p5 == NULL) {
            Bfree(b);
            return NULL;
        }
    }
    Bfree(p5);
    return b;
}